

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.hpp
# Opt level: O2

TimeRepresentation<count_time<9,_long>_> __thiscall
gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
          (utilities *this,string_view timeString)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  double t;
  string_view timeString_00;
  
  timeString_00._M_str = (char *)timeString._M_len;
  timeString_00._M_len = (size_t)this;
  t = getTimeValue(timeString_00,sec);
  TVar1.internalTimeCode = count_time<9,_long>::convert(t);
  return (TimeRepresentation<count_time<9,_long>_>)TVar1.internalTimeCode;
}

Assistant:

timeX loadTimeFromString(std::string_view timeString)
{
    return timeX(getTimeValue(timeString));
}